

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_states.hpp
# Opt level: O2

bool __thiscall
afsm::detail::
state_machine_base_impl<vending::vending_def,afsm::none,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>
::is_in_substate<vending::vending_def::on::serving::idle,vending::vending_def::on>
          (state_machine_base_impl<vending::vending_def,afsm::none,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>
           *this,type_tuple<vending::vending_def::on> *param_1)

{
  bool bVar1;
  undefined8 in_RAX;
  size_type in_RDX;
  size_type extraout_RDX;
  initializer_list<bool> args;
  undefined8 uStack_8;
  
  uStack_8 = in_RAX;
  if (*(long *)(this + 0x48) == 0) {
    bVar1 = state_machine_base_impl<vending::vending_def::on,_afsm::none,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>
            ::is_in_state<vending::vending_def::on::serving::idle>
                      ((state_machine_base_impl<vending::vending_def::on,_afsm::none,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>
                        *)(this + 0x58));
    in_RDX = extraout_RDX;
  }
  else {
    bVar1 = false;
  }
  uStack_8 = CONCAT17(bVar1,(undefined7)uStack_8);
  args._M_len = in_RDX;
  args._M_array = (iterator)0x1;
  bVar1 = psst::meta::any_of((meta *)((long)&uStack_8 + 7),args);
  return bVar1;
}

Assistant:

bool
    is_in_substate( ::psst::meta::type_tuple<ImmediateSubStates...> const& ) const
    {
        return ::psst::meta::any_of({
                (this->template is_in_state<ImmediateSubStates>() &&
                 this->template get_state< ImmediateSubStates >().
                            template is_in_state<StateDef>()) ...
        });
    }